

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  size_t sVar6;
  uint16_t *puVar7;
  uint32_t *puVar8;
  HasherCommon *pHVar9;
  Command *pCVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint8_t *puVar21;
  undefined8 uVar22;
  void *pvVar23;
  size_t sVar24;
  uint8_t *puVar25;
  long lVar26;
  byte bVar27;
  uint32_t uVar28;
  uint uVar29;
  int *piVar30;
  uint8_t *puVar31;
  BrotliEncoderDictionary *pBVar32;
  bool bVar33;
  uint8_t *local_1020;
  uint8_t *local_1010;
  uint8_t *local_1000;
  uint8_t *local_ff8;
  uint8_t *local_fe8;
  uint8_t *local_fd0;
  ulong local_fc8;
  uint8_t *local_fb8;
  uint8_t *local_fb0;
  ulong local_fa8;
  ulong local_fa0;
  ulong local_f98;
  uint8_t *local_f88;
  uint8_t *local_f80;
  uint8_t *local_f78;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_f08;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H6 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_d70;
  uint32_t delta;
  size_t nbits;
  size_t offset_4;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_c5a;
  uint32_t nbits_2;
  ushort local_c32;
  uint32_t offset_5;
  uint16_t bits64;
  ushort local_c0a;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  int is_ok_1;
  size_t score_7;
  size_t len_5;
  size_t backward_6;
  size_t prev_ix_5;
  size_t down_1;
  uint32_t *bucket_1;
  ulong uStack_b78;
  uint32_t key_2;
  size_t score_6;
  size_t len_4;
  size_t prev_ix_4;
  size_t backward_5;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  uint32_t *buckets_1;
  uint16_t *num_1;
  size_t matching_bits_6;
  uint64_t x_6;
  size_t limit2_6;
  size_t matched_6;
  ulong *local_a88;
  size_t local_a78;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_a48;
  size_t local_a38;
  ulong uStack_a10;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint32_t h_3;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_8;
  size_t backward_7;
  size_t matchlen_2;
  size_t offset_2;
  size_t matching_bits_7;
  uint64_t x_7;
  size_t limit2_7;
  size_t matched_7;
  ulong *local_8c8;
  size_t local_8b8;
  size_t score_5;
  size_t len_3;
  size_t prev_ix_3;
  size_t backward_4;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_7e0;
  size_t local_7d0;
  size_t score_9;
  size_t matchlen_3;
  uint8_t *string_1;
  BrotliTransforms *transforms_1;
  uint8_t *word_1;
  int transform_idx_1;
  int word_idx_1;
  int mask_1;
  uint32_t shift_1;
  size_t offset_3;
  BrotliDictionary *words_1;
  int address_1;
  int is_ok;
  size_t score_2;
  size_t len_2;
  size_t backward_2;
  size_t prev_ix_2;
  size_t down;
  uint32_t *bucket;
  ulong uStack_698;
  uint32_t key;
  size_t score_1;
  size_t len_1;
  size_t prev_ix_1;
  size_t backward_1;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_5a8;
  size_t local_598;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_568;
  size_t local_558;
  ulong uStack_530;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint32_t h_1;
  size_t transform_id;
  size_t cut;
  size_t score_3;
  size_t backward_3;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_3e8;
  size_t local_3d8;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_300;
  size_t local_2f0;
  size_t score_4;
  size_t matchlen_1;
  uint8_t *string;
  BrotliTransforms *transforms;
  uint8_t *word;
  int transform_idx;
  int word_idx;
  int mask;
  uint32_t shift;
  size_t offset_1;
  BrotliDictionary *words;
  int address;
  uint8_t *local_1f8;
  size_t i_4;
  size_t offset_6;
  size_t minor_ix;
  uint32_t key_4;
  uint32_t *buckets_2;
  uint16_t *num_2;
  size_t offset_8;
  size_t minor_ix_2;
  uint32_t key_6;
  uint32_t *buckets_4;
  uint16_t *num_4;
  size_t offset_7;
  size_t minor_ix_1;
  uint32_t key_5;
  uint32_t *buckets_3;
  uint16_t *num_3;
  uint64_t h_5;
  uint64_t h_6;
  uint64_t h_4;
  uint64_t h;
  uint64_t h_2;
  
  pCVar10 = commands;
  puVar15 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar6 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar16 = (uint8_t *)(position + num_bytes);
  local_f78 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_f78 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar14 = 0x200;
  if (params->quality < 9) {
    iVar14 = 0x40;
  }
  lVar17 = (long)iVar14;
  gap = position + lVar17;
  iVar14 = (hasher->privat)._H6.num_last_distances_to_check_;
  puVar25 = (uint8_t *)position;
  if (4 < iVar14) {
    iVar12 = *dist_cache;
    dist_cache[4] = iVar12 + -1;
    dist_cache[5] = iVar12 + 1;
    dist_cache[6] = iVar12 + -2;
    dist_cache[7] = iVar12 + 2;
    dist_cache[8] = iVar12 + -3;
    dist_cache[9] = iVar12 + 3;
    puVar25 = (uint8_t *)position;
    if (10 < iVar14) {
      iVar14 = dist_cache[1];
      dist_cache[10] = iVar14 + -1;
      dist_cache[0xb] = iVar14 + 1;
      dist_cache[0xc] = iVar14 + -2;
      dist_cache[0xd] = iVar14 + 2;
      dist_cache[0xe] = iVar14 + -3;
      dist_cache[0xf] = iVar14 + 3;
      puVar25 = (uint8_t *)position;
    }
  }
LAB_0010f0f7:
  do {
    ringbuffer_local = puVar25;
    if (puVar16 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar16 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar10 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar16 - (long)ringbuffer_local;
    local_f80 = puVar15;
    if (ringbuffer_local < puVar15) {
      local_f80 = ringbuffer_local;
    }
    local_f88 = puVar15;
    if (ringbuffer_local + sVar6 < puVar15) {
      local_f88 = ringbuffer_local + sVar6;
    }
    sr.len = 0;
    sr.distance = 0x7e4;
    sr.score = 0;
    pBVar32 = &params->dictionary;
    puVar25 = (uint8_t *)(params->dist).max_distance;
    puVar7 = (hasher->privat)._H6.num_;
    puVar8 = (hasher->privat)._H6.buckets_;
    uVar18 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    sStack_f08 = 0;
    sr.score._0_4_ = 0;
    while( true ) {
      bVar33 = false;
      if (*back_refs_position < back_refs_size) {
        bVar33 = (uint8_t *)(long)backward_references[*back_refs_position].position <
                 ringbuffer_local;
      }
      if (!bVar33) break;
      *back_refs_position = *back_refs_position + 1;
    }
    if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
       ((uint8_t *)(long)backward_references[*back_refs_position].position != ringbuffer_local)) {
      for (backward_1 = 0;
          backward_1 < (ulong)(long)(hasher->privat)._H6.num_last_distances_to_check_;
          backward_1 = backward_1 + 1) {
        puVar31 = (uint8_t *)(long)dist_cache[backward_1];
        if (((ringbuffer_local + -(long)puVar31 < ringbuffer_local) && (puVar31 <= local_f80)) &&
           ((uVar19 = ringbuffer_mask & (ulong)(ringbuffer_local + -(long)puVar31),
            uVar18 + i <= ringbuffer_mask &&
            ((uVar19 + i <= ringbuffer_mask && (ringbuffer[uVar18 + i] == ringbuffer[uVar19 + i]))))
           )) {
          local_568 = (ulong *)(ringbuffer + uVar18);
          limit2_1 = 0;
          x_1 = (max_distance >> 3) + 1;
LAB_0010f980:
          x_1 = x_1 - 1;
          if (x_1 != 0) {
            if (*local_568 == *(ulong *)(ringbuffer + limit2_1 + uVar19)) goto LAB_0010f9e2;
            iVar14 = 0;
            for (uVar19 = *local_568 ^ *(ulong *)(ringbuffer + limit2_1 + uVar19); (uVar19 & 1) == 0
                ; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              iVar14 = iVar14 + 1;
            }
            local_558 = ((ulong)(long)iVar14 >> 3) + limit2_1;
            goto LAB_0010fb23;
          }
          matched_1 = (max_distance & 7) + 1;
          while (matched_1 = matched_1 - 1, matched_1 != 0) {
            if (ringbuffer[limit2_1 + uVar19] != (uint8_t)*local_568) {
              local_558 = limit2_1;
              goto LAB_0010fb23;
            }
            local_568 = (ulong *)((long)local_568 + 1);
            limit2_1 = limit2_1 + 1;
          }
          local_558 = limit2_1;
LAB_0010fb23:
          score_1 = local_558;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_558)) {
            score_1 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (((2 < score_1) || ((score_1 == 2 && (backward_1 < 2)))) &&
             (uStack_698 = score_1 * 0x87 + 0x78f, best_len < uStack_698)) {
            if (backward_1 != 0) {
              uStack_698 = uStack_698 -
                           ((long)(int)(0x1ca10 >> ((byte)backward_1 & 0xe) & 0xe) + 0x27);
            }
            if (best_len < uStack_698) {
              best_len = uStack_698;
              i = score_1;
              sStack_f08 = score_1;
              sr.distance = uStack_698;
              sr.len = (size_t)puVar31;
            }
          }
        }
      }
      uVar19 = (*(ulong *)(ringbuffer + uVar18) & (hasher->privat)._H6.hash_mask_) *
               0x1fe35a7bd3579bd3 >> ((byte)(hasher->privat)._H35.hb.state & 0x3f);
      uVar29 = (int)uVar19 <<
               ((byte)*(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4) & 0x1f);
      if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar7[uVar19 & 0xffffffff]) {
        local_f98 = (ulong)puVar7[uVar19 & 0xffffffff] - (hasher->privat)._H5.block_size_;
      }
      else {
        local_f98 = 0;
      }
      backward_1 = (size_t)puVar7[uVar19 & 0xffffffff];
      while (local_f98 < backward_1) {
        backward_1 = backward_1 - 1;
        uVar20 = (ulong)puVar8[(ulong)uVar29 + (backward_1 & (hasher->privat)._H6.block_mask_)];
        puVar31 = ringbuffer_local + -uVar20;
        if (local_f80 < puVar31) break;
        uVar20 = ringbuffer_mask & uVar20;
        if (((uVar18 + i <= ringbuffer_mask) && (uVar20 + i <= ringbuffer_mask)) &&
           (ringbuffer[uVar18 + i] == ringbuffer[uVar20 + i])) {
          local_5a8 = (ulong *)(ringbuffer + uVar18);
          limit2_2 = 0;
          x_2 = (max_distance >> 3) + 1;
LAB_0010ff1c:
          x_2 = x_2 - 1;
          if (x_2 != 0) {
            if (*local_5a8 == *(ulong *)(ringbuffer + limit2_2 + uVar20)) goto LAB_0010ff7e;
            iVar14 = 0;
            for (uVar20 = *local_5a8 ^ *(ulong *)(ringbuffer + limit2_2 + uVar20); (uVar20 & 1) == 0
                ; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              iVar14 = iVar14 + 1;
            }
            local_598 = ((ulong)(long)iVar14 >> 3) + limit2_2;
            goto LAB_001100bf;
          }
          matched_2 = (max_distance & 7) + 1;
          while (matched_2 = matched_2 - 1, matched_2 != 0) {
            if (ringbuffer[limit2_2 + uVar20] != (uint8_t)*local_5a8) {
              local_598 = limit2_2;
              goto LAB_001100bf;
            }
            local_5a8 = (ulong *)((long)local_5a8 + 1);
            limit2_2 = limit2_2 + 1;
          }
          local_598 = limit2_2;
LAB_001100bf:
          score_2 = local_598;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_598)) {
            score_2 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (3 < score_2) {
            iVar14 = 0x1f;
            if ((uint)puVar31 != 0) {
              for (; (uint)puVar31 >> iVar14 == 0; iVar14 = iVar14 + -1) {
              }
            }
            uVar20 = (score_2 * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
            if (best_len < uVar20) {
              i = score_2;
              sStack_f08 = score_2;
              sr.len = (size_t)puVar31;
              sr.distance = uVar20;
              best_len = uVar20;
            }
          }
        }
      }
      puVar8[(ulong)uVar29 +
             (ulong)((uint)puVar7[uVar19 & 0xffffffff] & (hasher->privat)._H6.block_mask_)] =
           (uint32_t)ringbuffer_local;
      puVar7[uVar19 & 0xffffffff] = puVar7[uVar19 & 0xffffffff] + 1;
LAB_0011025a:
      if (sr.distance == 0x7e4) {
        if (back_refs_size == 0) {
          pHVar9 = (hasher->privat)._H6.common_;
          piVar30 = (int *)(ringbuffer + uVar18);
          if (pHVar9->dict_num_lookups >> 7 <= pHVar9->dict_num_matches) {
            i_1 = (size_t)(((uint)(*piVar30 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_530 = 0; uStack_530 < 2; uStack_530 = uStack_530 + 1) {
              pHVar9->dict_num_lookups = pHVar9->dict_num_lookups + 1;
              if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
                bVar1 = (params->dictionary).hash_table_lengths[i_1];
                uVar19 = (ulong)bVar1;
                uVar18 = (ulong)(params->dictionary).hash_table_words[i_1];
                if (max_distance < uVar19) {
                  bVar33 = false;
                }
                else {
                  local_3e8 = (ulong *)(pBVar32->words->data +
                                       (ulong)pBVar32->words->offsets_by_length[uVar19] +
                                       uVar19 * uVar18);
                  limit2_3 = 0;
                  x_3 = (ulong)(bVar1 >> 3) + 1;
LAB_00110500:
                  x_3 = x_3 - 1;
                  if (x_3 != 0) {
                    if (*local_3e8 == *(ulong *)((long)piVar30 + limit2_3)) goto LAB_00110562;
                    iVar14 = 0;
                    for (uVar20 = *local_3e8 ^ *(ulong *)((long)piVar30 + limit2_3);
                        (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      iVar14 = iVar14 + 1;
                    }
                    local_3d8 = ((ulong)(long)iVar14 >> 3) + limit2_3;
                    goto LAB_001106a3;
                  }
                  matched_3 = (uVar19 & 7) + 1;
                  while (matched_3 = matched_3 - 1, matched_3 != 0) {
                    if (*(char *)((long)piVar30 + limit2_3) != (char)*local_3e8) {
                      local_3d8 = limit2_3;
                      goto LAB_001106a3;
                    }
                    local_3e8 = (ulong *)((long)local_3e8 + 1);
                    limit2_3 = limit2_3 + 1;
                  }
                  local_3d8 = limit2_3;
LAB_001106a3:
                  if ((uVar19 < local_3d8 + (params->dictionary).cutoffTransformsCount) &&
                     (local_3d8 != 0)) {
                    puVar31 = local_f88 +
                              ((uVar19 - local_3d8) * 4 +
                               ((params->dictionary).cutoffTransforms >>
                                ((char)(uVar19 - local_3d8) * '\x06' & 0x3fU) & 0x3f) <<
                              (pBVar32->words->size_bits_by_length[uVar19] & 0x3f)) + uVar18 + 1;
                    if (puVar25 < puVar31) {
                      bVar33 = false;
                    }
                    else {
                      iVar14 = 0x1f;
                      if ((uint)puVar31 != 0) {
                        for (; (uint)puVar31 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                        }
                      }
                      uVar18 = (local_3d8 * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
                      if (uVar18 < sr.distance) {
                        bVar33 = false;
                      }
                      else {
                        sStack_f08 = local_3d8;
                        sr.score._0_4_ = (uint)bVar1 - (int)local_3d8;
                        bVar33 = true;
                        sr.len = (size_t)puVar31;
                        sr.distance = uVar18;
                      }
                    }
                  }
                  else {
                    bVar33 = false;
                  }
                }
                if (bVar33) {
                  pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
                }
              }
              i_1 = i_1 + 1;
            }
          }
        }
        else if (((*back_refs_position < back_refs_size) &&
                 ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                  ringbuffer_local)) &&
                (backward_references[*back_refs_position].max_distance <
                 backward_references[*back_refs_position].distance)) {
          uVar29 = backward_references[*back_refs_position].distance;
          iVar14 = backward_references[*back_refs_position].copy_len;
          if ((((int)uVar29 < 0x7ffffffd) && (3 < iVar14)) && (iVar14 < 0x19)) {
            uVar11 = (uVar29 - (int)local_f80) - 1;
            uVar4 = pBVar32->words->offsets_by_length[iVar14];
            bVar1 = pBVar32->words->size_bits_by_length[iVar14];
            uVar3 = kBitMask[bVar1];
            iVar12 = (int)uVar11 >> (bVar1 & 0x1f);
            if (iVar12 < (int)(params->dictionary).num_transforms) {
              puVar25 = pBVar32->words->data;
              uVar22 = BrotliGetTransforms();
              pvVar23 = malloc((long)iVar14 * 10);
              iVar12 = BrotliTransformDictionaryWord
                                 (pvVar23,puVar25 + (long)(int)((uVar11 & uVar3) * iVar14) +
                                                    (ulong)uVar4,iVar14,uVar22,iVar12);
              sVar24 = (size_t)iVar12;
              iVar13 = memcmp(ringbuffer + uVar18,pvVar23,sVar24);
              if (iVar13 == 0) {
                iVar13 = 0x1f;
                if (uVar29 != 0) {
                  for (; uVar29 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                sr.distance = (sVar24 * 0x87 + 0x780) - (ulong)(uint)(iVar13 * 0x1e);
                sr.score._0_4_ = iVar14 - iVar12;
                sr.len = (size_t)(int)uVar29;
                sStack_f08 = sVar24;
              }
            }
          }
        }
      }
    }
    else {
      uVar29 = backward_references[*back_refs_position].distance;
      uVar19 = (ulong)(int)uVar29;
      if ((ringbuffer_local + -uVar19 < ringbuffer_local) &&
         (uVar19 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
        uVar20 = ringbuffer_mask & (ulong)(ringbuffer_local + -uVar19);
        local_300 = (ulong *)(ringbuffer + uVar18);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_0010f574:
        x = x - 1;
        if (x != 0) {
          if (*local_300 == *(ulong *)(ringbuffer + limit2 + uVar20)) goto LAB_0010f5d6;
          iVar14 = 0;
          for (uVar20 = *local_300 ^ *(ulong *)(ringbuffer + limit2 + uVar20); (uVar20 & 1) == 0;
              uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            iVar14 = iVar14 + 1;
          }
          local_2f0 = ((ulong)(long)iVar14 >> 3) + limit2;
          goto LAB_0010f717;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar20] != (uint8_t)*local_300) {
            local_2f0 = limit2;
            goto LAB_0010f717;
          }
          local_300 = (ulong *)((long)local_300 + 1);
          limit2 = limit2 + 1;
        }
        local_2f0 = limit2;
LAB_0010f717:
        score = local_2f0;
        if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_2f0) {
          score = (size_t)backward_references[*back_refs_position].copy_len;
        }
        iVar14 = 0x1f;
        if (uVar29 != 0) {
          for (; uVar29 >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        sr.distance = (score * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
        sStack_f08 = score;
        sr.len = uVar19;
      }
      if (sr.score._4_4_ == 0) goto LAB_0011025a;
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar25 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_fa0 = sStack_f08 - 1;
            if (max_distance <= local_fa0) {
              local_fa0 = max_distance;
            }
            local_fa8 = local_fa0;
          }
          else {
            local_fa8 = 0;
          }
          sr2.len = 0;
          sr2.distance = 0x7e4;
          sr2.score._4_4_ = 0;
          local_fb0 = puVar15;
          if (ringbuffer_local + 1 < puVar15) {
            local_fb0 = ringbuffer_local + 1;
          }
          local_fb8 = puVar15;
          if (ringbuffer_local + sVar6 + 1 < puVar15) {
            local_fb8 = ringbuffer_local + sVar6 + 1;
          }
          pBVar32 = &params->dictionary;
          puVar31 = ringbuffer_local + 1;
          puVar25 = (uint8_t *)(params->dist).max_distance;
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar18 = (ulong)puVar31 & ringbuffer_mask;
          best_len_1 = 0x7e4;
          i_2 = local_fa8;
          distance_code = 0;
          sr2.score._0_4_ = 0;
          while( true ) {
            bVar33 = false;
            if (*back_refs_position < back_refs_size) {
              bVar33 = (uint8_t *)(long)backward_references[*back_refs_position].position < puVar31;
            }
            if (!bVar33) break;
            *back_refs_position = *back_refs_position + 1;
          }
          if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
             ((uint8_t *)(long)backward_references[*back_refs_position].position != puVar31)) {
            for (backward_5 = 0;
                backward_5 < (ulong)(long)(hasher->privat)._H6.num_last_distances_to_check_;
                backward_5 = backward_5 + 1) {
              puVar21 = (uint8_t *)(long)dist_cache[backward_5];
              if (((puVar31 + -(long)puVar21 < puVar31) && (puVar21 <= local_fb0)) &&
                 ((uVar19 = ringbuffer_mask & (ulong)(puVar31 + -(long)puVar21),
                  uVar18 + i_2 <= ringbuffer_mask &&
                  ((uVar19 + i_2 <= ringbuffer_mask &&
                   (ringbuffer[uVar18 + i_2] == ringbuffer[uVar19 + i_2])))))) {
                local_a48 = (ulong *)(ringbuffer + uVar18);
                limit2_5 = 0;
                x_5 = (max_distance >> 3) + 1;
LAB_001115a1:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_a48 == *(ulong *)(ringbuffer + limit2_5 + uVar19)) goto LAB_00111603;
                  iVar14 = 0;
                  for (uVar19 = *local_a48 ^ *(ulong *)(ringbuffer + limit2_5 + uVar19);
                      (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                    iVar14 = iVar14 + 1;
                  }
                  local_a38 = ((ulong)(long)iVar14 >> 3) + limit2_5;
                  goto LAB_00111744;
                }
                matched_5 = (max_distance & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (ringbuffer[limit2_5 + uVar19] != (uint8_t)*local_a48) {
                    local_a38 = limit2_5;
                    goto LAB_00111744;
                  }
                  local_a48 = (ulong *)((long)local_a48 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_a38 = limit2_5;
LAB_00111744:
                score_6 = local_a38;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar31 + local_a38)) {
                  score_6 = (long)backward_references[*back_refs_position].position - (long)puVar31;
                }
                if (((2 < score_6) || ((score_6 == 2 && (backward_5 < 2)))) &&
                   (uStack_b78 = score_6 * 0x87 + 0x78f, best_len_1 < uStack_b78)) {
                  if (backward_5 != 0) {
                    uStack_b78 = uStack_b78 -
                                 ((long)(int)(0x1ca10 >> ((byte)backward_5 & 0xe) & 0xe) + 0x27);
                  }
                  if (best_len_1 < uStack_b78) {
                    best_len_1 = uStack_b78;
                    i_2 = score_6;
                    distance_code = score_6;
                    sr2.distance = uStack_b78;
                    sr2.len = (size_t)puVar21;
                  }
                }
              }
            }
            uVar19 = (*(ulong *)(ringbuffer + uVar18) & (hasher->privat)._H6.hash_mask_) *
                     0x1fe35a7bd3579bd3 >> ((byte)(hasher->privat)._H35.hb.state & 0x3f);
            uVar29 = (int)uVar19 <<
                     ((byte)*(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4) & 0x1f);
            if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar7[uVar19 & 0xffffffff]) {
              local_fc8 = (ulong)puVar7[uVar19 & 0xffffffff] - (hasher->privat)._H5.block_size_;
            }
            else {
              local_fc8 = 0;
            }
            backward_5 = (size_t)puVar7[uVar19 & 0xffffffff];
            while (local_fc8 < backward_5) {
              backward_5 = backward_5 - 1;
              uVar20 = (ulong)puVar8[(ulong)uVar29 + (backward_5 & (hasher->privat)._H6.block_mask_)
                                    ];
              puVar21 = puVar31 + -uVar20;
              if (local_fb0 < puVar21) break;
              uVar20 = ringbuffer_mask & uVar20;
              if (((uVar18 + i_2 <= ringbuffer_mask) && (uVar20 + i_2 <= ringbuffer_mask)) &&
                 (ringbuffer[uVar18 + i_2] == ringbuffer[uVar20 + i_2])) {
                local_a88 = (ulong *)(ringbuffer + uVar18);
                limit2_6 = 0;
                x_6 = (max_distance >> 3) + 1;
LAB_00111b3d:
                x_6 = x_6 - 1;
                if (x_6 != 0) {
                  if (*local_a88 == *(ulong *)(ringbuffer + limit2_6 + uVar20)) goto LAB_00111b9f;
                  iVar14 = 0;
                  for (uVar20 = *local_a88 ^ *(ulong *)(ringbuffer + limit2_6 + uVar20);
                      (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                    iVar14 = iVar14 + 1;
                  }
                  local_a78 = ((ulong)(long)iVar14 >> 3) + limit2_6;
                  goto LAB_00111ce0;
                }
                matched_6 = (max_distance & 7) + 1;
                while (matched_6 = matched_6 - 1, matched_6 != 0) {
                  if (ringbuffer[limit2_6 + uVar20] != (uint8_t)*local_a88) {
                    local_a78 = limit2_6;
                    goto LAB_00111ce0;
                  }
                  local_a88 = (ulong *)((long)local_a88 + 1);
                  limit2_6 = limit2_6 + 1;
                }
                local_a78 = limit2_6;
LAB_00111ce0:
                score_7 = local_a78;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar31 + local_a78)) {
                  score_7 = (long)backward_references[*back_refs_position].position - (long)puVar31;
                }
                if (3 < score_7) {
                  iVar14 = 0x1f;
                  if ((uint)puVar21 != 0) {
                    for (; (uint)puVar21 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                    }
                  }
                  uVar20 = (score_7 * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
                  if (best_len_1 < uVar20) {
                    i_2 = score_7;
                    distance_code = score_7;
                    sr2.len = (size_t)puVar21;
                    sr2.distance = uVar20;
                    best_len_1 = uVar20;
                  }
                }
              }
            }
            puVar8[(ulong)uVar29 +
                   (ulong)((uint)puVar7[uVar19 & 0xffffffff] & (hasher->privat)._H6.block_mask_)] =
                 (uint32_t)puVar31;
            puVar7[uVar19 & 0xffffffff] = puVar7[uVar19 & 0xffffffff] + 1;
LAB_00111e7b:
            if (sr2.distance == 0x7e4) {
              if (back_refs_size == 0) {
                pHVar9 = (hasher->privat)._H6.common_;
                piVar30 = (int *)(ringbuffer + uVar18);
                if (pHVar9->dict_num_lookups >> 7 <= pHVar9->dict_num_matches) {
                  i_3 = (size_t)(((uint)(*piVar30 * 0x1e35a7bd) >> 0x12) << 1);
                  for (uStack_a10 = 0; uStack_a10 < 2; uStack_a10 = uStack_a10 + 1) {
                    pHVar9->dict_num_lookups = pHVar9->dict_num_lookups + 1;
                    if ((params->dictionary).hash_table_lengths[i_3] != '\0') {
                      bVar1 = (params->dictionary).hash_table_lengths[i_3];
                      uVar19 = (ulong)bVar1;
                      uVar18 = (ulong)(params->dictionary).hash_table_words[i_3];
                      if (max_distance < uVar19) {
                        bVar33 = false;
                      }
                      else {
                        local_8c8 = (ulong *)(pBVar32->words->data +
                                             (ulong)pBVar32->words->offsets_by_length[uVar19] +
                                             uVar19 * uVar18);
                        limit2_7 = 0;
                        x_7 = (ulong)(bVar1 >> 3) + 1;
LAB_00112121:
                        x_7 = x_7 - 1;
                        if (x_7 != 0) {
                          if (*local_8c8 == *(ulong *)((long)piVar30 + limit2_7)) goto LAB_00112183;
                          iVar14 = 0;
                          for (uVar20 = *local_8c8 ^ *(ulong *)((long)piVar30 + limit2_7);
                              (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                            iVar14 = iVar14 + 1;
                          }
                          local_8b8 = ((ulong)(long)iVar14 >> 3) + limit2_7;
                          goto LAB_001122c4;
                        }
                        matched_7 = (uVar19 & 7) + 1;
                        while (matched_7 = matched_7 - 1, matched_7 != 0) {
                          if (*(char *)((long)piVar30 + limit2_7) != (char)*local_8c8) {
                            local_8b8 = limit2_7;
                            goto LAB_001122c4;
                          }
                          local_8c8 = (ulong *)((long)local_8c8 + 1);
                          limit2_7 = limit2_7 + 1;
                        }
                        local_8b8 = limit2_7;
LAB_001122c4:
                        if ((uVar19 < local_8b8 + (params->dictionary).cutoffTransformsCount) &&
                           (local_8b8 != 0)) {
                          puVar31 = local_fb8 +
                                    ((uVar19 - local_8b8) * 4 +
                                     ((params->dictionary).cutoffTransforms >>
                                      ((char)(uVar19 - local_8b8) * '\x06' & 0x3fU) & 0x3f) <<
                                    (pBVar32->words->size_bits_by_length[uVar19] & 0x3f)) +
                                    uVar18 + 1;
                          if (puVar25 < puVar31) {
                            bVar33 = false;
                          }
                          else {
                            iVar14 = 0x1f;
                            if ((uint)puVar31 != 0) {
                              for (; (uint)puVar31 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                              }
                            }
                            uVar18 = (local_8b8 * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
                            if (uVar18 < sr2.distance) {
                              bVar33 = false;
                            }
                            else {
                              distance_code = local_8b8;
                              sr2.score._0_4_ = (uint)bVar1 - (int)local_8b8;
                              bVar33 = true;
                              sr2.len = (size_t)puVar31;
                              sr2.distance = uVar18;
                            }
                          }
                        }
                        else {
                          bVar33 = false;
                        }
                      }
                      if (bVar33) {
                        pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
                      }
                    }
                    i_3 = i_3 + 1;
                  }
                }
              }
              else if (((*back_refs_position < back_refs_size) &&
                       ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                        puVar31)) &&
                      (backward_references[*back_refs_position].max_distance <
                       backward_references[*back_refs_position].distance)) {
                uVar29 = backward_references[*back_refs_position].distance;
                iVar14 = backward_references[*back_refs_position].copy_len;
                if ((((int)uVar29 < 0x7ffffffd) && (3 < iVar14)) && (iVar14 < 0x19)) {
                  uVar11 = (uVar29 - (int)local_fb0) - 1;
                  uVar4 = pBVar32->words->offsets_by_length[iVar14];
                  bVar1 = pBVar32->words->size_bits_by_length[iVar14];
                  uVar3 = kBitMask[bVar1];
                  iVar12 = (int)uVar11 >> (bVar1 & 0x1f);
                  if (iVar12 < (int)(params->dictionary).num_transforms) {
                    puVar25 = pBVar32->words->data;
                    uVar22 = BrotliGetTransforms();
                    pvVar23 = malloc((long)iVar14 * 10);
                    iVar12 = BrotliTransformDictionaryWord
                                       (pvVar23,puVar25 + (long)(int)((uVar11 & uVar3) * iVar14) +
                                                          (ulong)uVar4,iVar14,uVar22,iVar12);
                    sVar24 = (size_t)iVar12;
                    iVar13 = memcmp(ringbuffer + uVar18,pvVar23,sVar24);
                    if (iVar13 == 0) {
                      iVar13 = 0x1f;
                      if (uVar29 != 0) {
                        for (; uVar29 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                        }
                      }
                      sr2.distance = (sVar24 * 0x87 + 0x780) - (ulong)(uint)(iVar13 * 0x1e);
                      sr2.score._0_4_ = iVar14 - iVar12;
                      sr2.len = (size_t)(int)uVar29;
                      distance_code = sVar24;
                    }
                  }
                }
                sr2.score._4_4_ = 1;
              }
            }
          }
          else {
            uVar29 = backward_references[*back_refs_position].distance;
            uVar19 = (ulong)(int)uVar29;
            if ((puVar31 + -uVar19 < puVar31) &&
               (uVar19 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
              uVar20 = ringbuffer_mask & (ulong)(puVar31 + -uVar19);
              local_7e0 = (ulong *)(ringbuffer + uVar18);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_00111195:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_7e0 == *(ulong *)(ringbuffer + limit2_4 + uVar20)) goto LAB_001111f7;
                iVar14 = 0;
                for (uVar20 = *local_7e0 ^ *(ulong *)(ringbuffer + limit2_4 + uVar20);
                    (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  iVar14 = iVar14 + 1;
                }
                local_7d0 = ((ulong)(long)iVar14 >> 3) + limit2_4;
                goto LAB_00111338;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar20] != (uint8_t)*local_7e0) {
                  local_7d0 = limit2_4;
                  goto LAB_00111338;
                }
                local_7e0 = (ulong *)((long)local_7e0 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_7d0 = limit2_4;
LAB_00111338:
              score_5 = local_7d0;
              if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_7d0) {
                score_5 = (size_t)backward_references[*back_refs_position].copy_len;
              }
              iVar14 = 0x1f;
              if (uVar29 != 0) {
                for (; uVar29 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              sr2.distance = (score_5 * 0x87 + 0x780) - (ulong)(uint)(iVar14 * 0x1e);
              distance_code = score_5;
              sr2.score._4_4_ = 1;
              sr2.len = uVar19;
            }
            if (sr2.score._4_4_ == 0) goto LAB_00111e7b;
          }
          if ((sr2.distance < sr.distance + 0xaf) &&
             (puVar25 = ringbuffer_local, sr2.score._4_4_ == 0)) break;
          puVar25 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_f08 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = CONCAT44(sr2.score._4_4_,(int)sr2.score);
          if ((sr2.score._4_4_ != 0) ||
             ((cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1, 3 < cost_diff_lazy._4_4_ ||
              (puVar31 = ringbuffer_local + 9, ringbuffer_local = puVar25, puVar16 <= puVar31))))
          break;
        } while( true );
      }
      ringbuffer_local = puVar25;
      gap = (size_t)(ringbuffer_local + lVar17 + sStack_f08 * 2);
      local_fd0 = puVar15;
      if (ringbuffer_local + sVar6 < puVar15) {
        local_fd0 = ringbuffer_local + sVar6;
      }
      if (local_fd0 < sr.len) {
LAB_00112b79:
        local_d70 = sr.len + 0xf;
      }
      else {
        uVar18 = (sr.len + 3) - (long)*dist_cache;
        uVar19 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_d70 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_d70 = 1;
        }
        else if (uVar18 < 7) {
          local_d70 = (ulong)(int)(0x9750468 >> ((byte)((uVar18 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar19 < 7) {
          local_d70 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar19 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_d70 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_00112b79;
          local_d70 = 3;
        }
      }
      if ((sr.len <= local_fd0) && (local_d70 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
        iVar14 = (hasher->privat)._H6.num_last_distances_to_check_;
        if (4 < iVar14) {
          iVar12 = *dist_cache;
          dist_cache[4] = iVar12 + -1;
          dist_cache[5] = iVar12 + 1;
          dist_cache[6] = iVar12 + -2;
          dist_cache[7] = iVar12 + 2;
          dist_cache[8] = iVar12 + -3;
          dist_cache[9] = iVar12 + 3;
          if (10 < iVar14) {
            iVar14 = dist_cache[1];
            dist_cache[10] = iVar14 + -1;
            dist_cache[0xb] = iVar14 + 1;
            dist_cache[0xc] = iVar14 + -2;
            dist_cache[0xd] = iVar14 + 2;
            dist_cache[0xe] = iVar14 + -3;
            dist_cache[0xf] = iVar14 + 3;
          }
        }
      }
      uVar28 = (uint32_t)pos_end;
      commands->insert_len_ = uVar28;
      commands->copy_len_ = (uint)sStack_f08 | (int)sr.score << 0x19;
      uVar29 = (params->dist).num_direct_distance_codes;
      uVar4 = (params->dist).distance_postfix_bits;
      if (local_d70 < (ulong)uVar29 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_d70;
        commands->dist_extra_ = 0;
      }
      else {
        bVar1 = (byte)uVar4;
        uVar18 = (1L << (bVar1 + 2 & 0x3f)) + ((local_d70 - 0x10) - (ulong)uVar29);
        iVar14 = 0x1f;
        if ((uint)uVar18 != 0) {
          for (; (uint)uVar18 >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        bVar27 = (byte)(iVar14 - 1U);
        uVar19 = uVar18 >> (bVar27 & 0x3f) & 1;
        lVar26 = (ulong)(iVar14 - 1U) - (ulong)uVar4;
        commands->dist_prefix_ =
             (short)lVar26 * 0x400 |
             (short)uVar29 + 0x10 + (short)((lVar26 + -1) * 2 + uVar19 << (bVar1 & 0x3f)) +
             ((ushort)uVar18 & (short)(1 << (bVar1 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar18 - (uVar19 + 2 << (bVar27 & 0x3f)) >> (bVar1 & 0x3f));
      }
      iVar14 = (uint)sStack_f08 + (int)sr.score;
      uVar18 = (ulong)iVar14;
      if (pos_end < 6) {
        local_c5a = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar12 = 0x1f;
        if (uVar28 - 2 != 0) {
          for (; uVar28 - 2 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_c5a = (short)(iVar12 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar12 + -1) & 0x3f))
                    + 2;
      }
      else if (pos_end < 0x842) {
        iVar12 = 0x1f;
        if (uVar28 - 0x42 != 0) {
          for (; uVar28 - 0x42 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_c5a = (short)iVar12 + 10;
      }
      else if (pos_end < 0x1842) {
        local_c5a = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_c5a = 0x16;
      }
      else {
        local_c5a = 0x17;
      }
      if (uVar18 < 10) {
        local_c32 = (short)iVar14 - 2;
      }
      else if (uVar18 < 0x86) {
        iVar12 = 0x1f;
        if (iVar14 - 6U != 0) {
          for (; iVar14 - 6U >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_c32 = (short)(iVar12 + -1) * 2 + (short)(uVar18 - 6 >> ((byte)(iVar12 + -1) & 0x3f)) +
                    4;
      }
      else if (uVar18 < 0x846) {
        iVar12 = 0x1f;
        if (iVar14 - 0x46U != 0) {
          for (; iVar14 - 0x46U >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_c32 = (short)iVar12 + 0xc;
      }
      else {
        local_c32 = 0x17;
      }
      local_c0a = local_c32 & 7 | (local_c5a & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_c5a < 8)) && (local_c32 < 0x10)) {
        if (7 < local_c32) {
          local_c0a = local_c0a | 0x40;
        }
      }
      else {
        iVar14 = ((int)(uint)local_c32 >> 3) + ((int)(uint)local_c5a >> 3) * 3;
        local_c0a = (short)iVar14 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) | local_c0a;
      }
      commands->cmd_prefix_ = local_c0a;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_fe8 = ringbuffer_local + sStack_f08;
      if (local_f78 <= local_fe8) {
        local_fe8 = local_f78;
      }
      if (sr.len < sStack_f08 >> 2) {
        local_ff8 = ringbuffer_local + sr.len * -4 + sStack_f08;
        if (local_ff8 < range_end) {
          local_ff8 = (uint8_t *)range_end;
        }
        if (local_fe8 < local_ff8) {
          local_1000 = local_fe8;
        }
        else {
          local_1000 = local_ff8;
        }
        range_end = (size_t)local_1000;
      }
      for (local_1f8 = (uint8_t *)range_end; local_1f8 < local_fe8; local_1f8 = local_1f8 + 1) {
        puVar7 = (hasher->privat)._H6.num_;
        puVar8 = (hasher->privat)._H6.buckets_;
        uVar18 = (*(ulong *)(ringbuffer + ((ulong)local_1f8 & ringbuffer_mask)) &
                 (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                 ((byte)(hasher->privat)._H35.hb.state & 0x3f);
        uVar2 = puVar7[uVar18 & 0xffffffff];
        uVar29 = (hasher->privat)._H6.block_mask_;
        uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
        puVar7[uVar18 & 0xffffffff] = puVar7[uVar18 & 0xffffffff] + 1;
        puVar8[(ulong)(uVar2 & uVar29) + (ulong)(uint)((int)uVar18 << ((byte)uVar5 & 0x1f))] =
             (uint32_t)local_1f8;
      }
      commands = commands + 1;
      puVar25 = ringbuffer_local + sStack_f08;
      goto LAB_0010f0f7;
    }
    pos_end = pos_end + 1;
    puVar25 = ringbuffer_local + 1;
    if ((gap < puVar25) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar17 * 4) < puVar25) {
        puVar31 = ringbuffer_local + 0x11;
        local_1010 = puVar16 + -7;
        ringbuffer_local = puVar25;
        if (puVar31 < local_1010) {
          local_1010 = puVar31;
        }
        for (; puVar25 = ringbuffer_local, ringbuffer_local < local_1010;
            ringbuffer_local = ringbuffer_local + 4) {
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar18 = (*(ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) &
                   (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(hasher->privat)._H35.hb.state & 0x3f);
          uVar2 = puVar7[uVar18 & 0xffffffff];
          uVar29 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
          puVar7[uVar18 & 0xffffffff] = puVar7[uVar18 & 0xffffffff] + 1;
          puVar8[(ulong)(uVar2 & uVar29) + (ulong)(uint)((int)uVar18 << ((byte)uVar5 & 0x1f))] =
               (uint32_t)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar31 = ringbuffer_local + 9;
        local_1020 = puVar16 + -7;
        ringbuffer_local = puVar25;
        if (puVar31 < local_1020) {
          local_1020 = puVar31;
        }
        for (; puVar25 = ringbuffer_local, ringbuffer_local < local_1020;
            ringbuffer_local = ringbuffer_local + 2) {
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar18 = (*(ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) &
                   (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(hasher->privat)._H35.hb.state & 0x3f);
          uVar2 = puVar7[uVar18 & 0xffffffff];
          uVar29 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
          puVar7[uVar18 & 0xffffffff] = puVar7[uVar18 & 0xffffffff] + 1;
          puVar8[(ulong)(uVar2 & uVar29) + (ulong)(uint)((int)uVar18 << ((byte)uVar5 & 0x1f))] =
               (uint32_t)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0010f9e2:
  local_568 = local_568 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0010f980;
LAB_0010ff7e:
  local_5a8 = local_5a8 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0010ff1c;
LAB_0010f5d6:
  local_300 = local_300 + 1;
  limit2 = limit2 + 8;
  goto LAB_0010f574;
LAB_00110562:
  local_3e8 = local_3e8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00110500;
LAB_00111603:
  local_a48 = local_a48 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_001115a1;
LAB_00111b9f:
  local_a88 = local_a88 + 1;
  limit2_6 = limit2_6 + 8;
  goto LAB_00111b3d;
LAB_001111f7:
  local_7e0 = local_7e0 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00111195;
LAB_00112183:
  local_8c8 = local_8c8 + 1;
  limit2_7 = limit2_7 + 8;
  goto LAB_00112121;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}